

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

path * __thiscall boost::filesystem::path::lexically_normal(path *__return_storage_ptr__,path *this)

{
  byte bVar1;
  bool bVar2;
  iterator itr_1;
  iterator last;
  string_type lf;
  iterator stop;
  iterator start;
  iterator next;
  iterator local_140;
  path local_110;
  path *local_f0;
  size_type local_e8;
  byte *local_e0;
  long local_d8;
  iterator local_c0;
  iterator local_90;
  iterator local_60;
  
  if ((this->m_pathname)._M_string_length == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  }
  else {
    (__return_storage_ptr__->m_pathname)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_pathname).field_2;
    (__return_storage_ptr__->m_pathname)._M_string_length = 0;
    (__return_storage_ptr__->m_pathname).field_2._M_local_buf[0] = '\0';
    begin(&local_90,this);
    local_110.m_pathname._M_dataplus._M_p = (pointer)&local_110.m_pathname.field_2;
    local_110.m_pathname._M_string_length = 0;
    local_110.m_pathname.field_2._M_local_buf[0] = '\0';
    local_e8 = (this->m_pathname)._M_string_length;
    local_f0 = this;
    iterators::detail::
    iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_true,_false>
    ::operator--(&local_c0,
                 (iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_true,_false>
                  *)&local_110,0);
    iterator::iterator(&local_140,&local_90);
    while ((local_140.m_path_ptr != local_c0.m_path_ptr || (local_140.m_pos != local_c0.m_pos))) {
      if (((local_140.m_element.m_pathname._M_string_length != 1) ||
          (*local_140.m_element.m_pathname._M_dataplus._M_p != '.')) ||
         (((local_140.m_path_ptr == local_90.m_path_ptr && (local_140.m_pos == local_90.m_pos)) ||
          ((local_140.m_path_ptr == local_f0 && (local_140.m_pos == local_e8)))))) {
        if ((((local_140.m_element.m_pathname._M_string_length == 2) &&
             ((__return_storage_ptr__->m_pathname)._M_string_length != 0)) &&
            (*local_140.m_element.m_pathname._M_dataplus._M_p == '.')) &&
           (local_140.m_element.m_pathname._M_dataplus._M_p[1] == '.')) {
          filename(&local_60.m_element,__return_storage_ptr__);
          std::__cxx11::string::string((string *)&local_e0,(string *)&local_60);
          std::__cxx11::string::~string((string *)&local_60);
          if (local_d8 != 0) {
            if (local_d8 != 2) {
              if (local_d8 == 1) {
                bVar1 = *local_e0 & 0xfe;
joined_r0x0011018c:
                if (bVar1 == 0x2e) goto LAB_0011018e;
              }
              remove_filename(__return_storage_ptr__);
              iterator::iterator(&local_60,&local_140);
              if ((((__return_storage_ptr__->m_pathname)._M_string_length == 0) &&
                  ((m_path_iterator_increment(&local_60), local_60.m_path_ptr != local_c0.m_path_ptr
                   || (local_60.m_pos != local_c0.m_pos)))) &&
                 ((local_60.m_path_ptr == local_f0 && (local_60.m_pos == local_e8)))) {
                detail::dot_path();
                bVar2 = operator==(&local_110,&detail::dot_path::dot_pth);
                if (bVar2) {
                  detail::dot_path();
                  operator/=(__return_storage_ptr__,&detail::dot_path::dot_pth);
                }
              }
              std::__cxx11::string::~string((string *)&local_60);
              std::__cxx11::string::~string((string *)&local_e0);
              goto LAB_001101a1;
            }
            if (*local_e0 != 0x2e) {
              bVar1 = local_e0[1];
              goto joined_r0x0011018c;
            }
          }
LAB_0011018e:
          std::__cxx11::string::~string((string *)&local_e0);
        }
        operator/=(__return_storage_ptr__,&local_140.m_element);
      }
LAB_001101a1:
      m_path_iterator_increment(&local_140);
    }
    std::__cxx11::string::~string((string *)&local_140);
    if ((__return_storage_ptr__->m_pathname)._M_string_length == 0) {
      detail::dot_path();
      operator/=(__return_storage_ptr__,&detail::dot_path::dot_pth);
    }
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

path path::lexically_normal() const
  {
    if (m_pathname.empty())
      return *this;
      
    path temp;
    iterator start(begin());
    iterator last(end());
    iterator stop(last--);
    for (iterator itr(start); itr != stop; ++itr)
    {
      // ignore "." except at start and last
      if (itr->native().size() == 1
        && (itr->native())[0] == dot
        && itr != start
        && itr != last) continue;

      // ignore a name and following ".."
      if (!temp.empty()
        && itr->native().size() == 2
        && (itr->native())[0] == dot
        && (itr->native())[1] == dot) // dot dot
      {
        string_type lf(temp.filename().native());  
        if (lf.size() > 0  
          && (lf.size() != 1
            || (lf[0] != dot
              && lf[0] != separator))
          && (lf.size() != 2 
            || (lf[0] != dot
              && lf[1] != dot
#             ifdef BOOST_WINDOWS_API
              && lf[1] != colon
#             endif
               )
             )
          )
        {
          temp.remove_filename();
          //// if not root directory, must also remove "/" if any
          //if (temp.native().size() > 0
          //  && temp.native()[temp.native().size()-1]
          //    == separator)
          //{
          //  string_type::size_type rds(
          //    root_directory_start(temp.native(), temp.native().size()));
          //  if (rds == string_type::npos
          //    || rds != temp.native().size()-1) 
          //  {
          //    temp.m_pathname.erase(temp.native().size()-1);
          //  }
          //}

          iterator next(itr);
          if (temp.empty() && ++next != stop
            && next == last && *last == detail::dot_path())
          {
            temp /= detail::dot_path();
          }
          continue;
        }
      }

      temp /= *itr;
    };

    if (temp.empty())
      temp /= detail::dot_path();
    return temp;
  }